

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  long lVar1;
  bool bVar2;
  string *in_RSI;
  PosixWritableFile *in_RDI;
  long in_FS_OFFSET;
  Status status;
  Status *in_stack_ffffffffffffff98;
  Status *in_stack_ffffffffffffffa0;
  PosixWritableFile *this_00;
  int in_stack_ffffffffffffffc4;
  PosixWritableFile *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  SyncDirIfManifest(in_stack_fffffffffffffff0);
  bVar2 = Status::ok(in_stack_ffffffffffffff98);
  if (bVar2) {
    FlushBuffer(this_00);
    Status::operator=((Status *)in_RDI,in_stack_ffffffffffffffa0);
    Status::~Status(in_stack_ffffffffffffff98);
    bVar2 = Status::ok(in_stack_ffffffffffffff98);
    if (bVar2) {
      SyncFd(in_stack_ffffffffffffffc4,in_RSI,SUB81((ulong)this_00 >> 0x38,0));
    }
    else {
      Status::Status(in_stack_ffffffffffffff98,(Status *)0xd54392);
    }
  }
  else {
    Status::Status(in_stack_ffffffffffffff98,(Status *)0xd5433e);
  }
  Status::~Status(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_, false);
  }